

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O2

StepStatus __thiscall
adios2::core::engine::ssc::SscWriterGeneric::BeginStep
          (SscWriterGeneric *this,StepMode mode,float timeoutSeconds,bool writerLocked)

{
  pointer ppoVar1;
  long lVar2;
  
  this->m_WriterDefinitionsLocked = writerLocked;
  if (((this->super_SscWriterBase).m_Threading == true) &&
     ((this->m_EndStepThread)._M_id._M_thread != 0)) {
    std::thread::join();
    writerLocked = this->m_WriterDefinitionsLocked;
  }
  lVar2 = (this->super_SscWriterBase).m_CurrentStep + 1;
  (this->super_SscWriterBase).m_CurrentStep = lVar2;
  if (((lVar2 == 0) || (writerLocked == false)) || (this->m_ReaderSelectionsLocked == false)) {
    Buffer::resize(&(this->super_SscWriterBase).m_Buffer,1);
    *(this->super_SscWriterBase).m_Buffer.m_Buffer = '\0';
    std::
    vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
    ::clear(&this->m_GlobalWritePattern);
    std::
    vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
    ::resize(&this->m_GlobalWritePattern,(long)(this->super_SscWriterBase).m_StreamSize);
    std::
    vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
    ::clear(&this->m_GlobalReadPattern);
    std::
    vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
    ::resize(&this->m_GlobalReadPattern,(long)(this->super_SscWriterBase).m_StreamSize);
    lVar2 = (this->super_SscWriterBase).m_CurrentStep;
  }
  if (1 < lVar2) {
    if ((this->m_WriterDefinitionsLocked == true) && (this->m_ReaderSelectionsLocked == true)) {
      ppoVar1 = (this->m_MpiRequests).
                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      MPI_Waitall((ulong)((long)(this->m_MpiRequests).
                                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppoVar1) >> 3,
                  ppoVar1,0);
      ppoVar1 = (this->m_MpiRequests).
                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->m_MpiRequests).
          super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppoVar1) {
        (this->m_MpiRequests).
        super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppoVar1;
      }
    }
    else {
      MPI_Win_free(&this->m_MpiWin);
    }
  }
  return OK;
}

Assistant:

StepStatus SscWriterGeneric::BeginStep(const StepMode mode, const float timeoutSeconds,
                                       const bool writerLocked)
{

    m_WriterDefinitionsLocked = writerLocked;

    if (m_Threading && m_EndStepThread.joinable())
    {
        m_EndStepThread.join();
    }

    ++m_CurrentStep;

    if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
        m_ReaderSelectionsLocked == false)
    {
        m_Buffer.resize(1);
        m_Buffer[0] = 0;
        m_GlobalWritePattern.clear();
        m_GlobalWritePattern.resize(m_StreamSize);
        m_GlobalReadPattern.clear();
        m_GlobalReadPattern.resize(m_StreamSize);
    }

    if (m_CurrentStep > 1)
    {
        if (m_WriterDefinitionsLocked && m_ReaderSelectionsLocked)
        {
            MPI_Waitall(static_cast<int>(m_MpiRequests.size()), m_MpiRequests.data(),
                        MPI_STATUSES_IGNORE);
            m_MpiRequests.clear();
        }
        else
        {
            MPI_Win_free(&m_MpiWin);
        }
    }

    return StepStatus::OK;
}